

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall
helics::CommonCore::getExtractionUnits_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  uchar uVar1;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  *p_Var2;
  undefined4 in_ESI;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  *handleInfo;
  undefined4 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  string *local_8;
  
  p_Var2 = getHandleInfo((CommonCore *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),
                         (InterfaceHandle)(BaseType)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if ((p_Var2 == (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                  *)0x0) ||
     ((uVar1 = (p_Var2->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>
               ._M_storage._M_storage.__data[4], uVar1 != 'i' && (uVar1 != 'p')))) {
    local_8 = (string *)gEmptyString_abi_cxx11_;
  }
  else {
    local_8 = (string *)
              ((long)&p_Var2[1].
                      super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                      .
                      super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>
                      ._M_storage._M_storage + 0x10);
  }
  return local_8;
}

Assistant:

const std::string& CommonCore::getExtractionUnits(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT:
            case InterfaceType::PUBLICATION:
                return handleInfo->units;
            default:
                break;
        }
    }
    return gEmptyString;
}